

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xxhash.h
# Opt level: O0

XXH64_hash_t XXH3_len_1to3_64b(xxh_u8 *input,size_t len,xxh_u8 *secret,XXH64_hash_t seed)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  xxh_u32 xVar4;
  xxh_u32 xVar5;
  xxh_u64 xVar6;
  long in_RCX;
  ulong in_RSI;
  byte *in_RDI;
  xxh_u64 keyed;
  xxh_u64 bitflip;
  xxh_u32 combined;
  xxh_u8 c3;
  xxh_u8 c2;
  xxh_u8 c1;
  
  bVar1 = *in_RDI;
  bVar2 = in_RDI[in_RSI >> 1];
  bVar3 = in_RDI[in_RSI - 1];
  xVar4 = XXH_readLE32((void *)0x129820);
  xVar5 = XXH_readLE32((void *)0x129832);
  xVar6 = XXH64_avalanche((ulong)((uint)bVar1 << 0x10 | (uint)bVar2 << 0x18 | (uint)bVar3 |
                                 (int)in_RSI << 8) ^ (ulong)(xVar4 ^ xVar5) + in_RCX);
  return xVar6;
}

Assistant:

XXH_FORCE_INLINE XXH64_hash_t XXH3_len_1to3_64b(const xxh_u8* input, size_t len,
                                                const xxh_u8* secret,
                                                XXH64_hash_t seed) {
  XXH_ASSERT(input != NULL);
  XXH_ASSERT(1 <= len && len <= 3);
  XXH_ASSERT(secret != NULL);
  /*
   * len = 1: combined = { input[0], 0x01, input[0], input[0] }
   * len = 2: combined = { input[1], 0x02, input[0], input[1] }
   * len = 3: combined = { input[2], 0x03, input[0], input[1] }
   */
  {
    xxh_u8 const c1 = input[0];
    xxh_u8 const c2 = input[len >> 1];
    xxh_u8 const c3 = input[len - 1];
    xxh_u32 const combined = ((xxh_u32)c1 << 16) | ((xxh_u32)c2 << 24) |
                             ((xxh_u32)c3 << 0) | ((xxh_u32)len << 8);
    xxh_u64 const bitflip =
        (XXH_readLE32(secret) ^ XXH_readLE32(secret + 4)) + seed;
    xxh_u64 const keyed = (xxh_u64)combined ^ bitflip;
    return XXH64_avalanche(keyed);
  }
}